

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_Error FT_Set_Renderer(FT_Library library,FT_Renderer_conflict renderer,FT_UInt num_params,
                        FT_Parameter *parameters)

{
  FT_ListNode pFVar1;
  FT_ListNode pFVar2;
  FT_Renderer_SetModeFunc p_Var3;
  FT_Error FVar4;
  FT_ListNode pFVar5;
  FT_ListNode pFVar6;
  
  if (library == (FT_Library)0x0) {
    return 0x21;
  }
  if (renderer == (FT_Renderer_conflict)0x0) {
    return 6;
  }
  if (num_params != 0 && parameters == (FT_Parameter *)0x0) {
    return 6;
  }
  pFVar5 = (library->renderers).head;
  while( true ) {
    if (pFVar5 == (FT_ListNode)0x0) {
      return 6;
    }
    if ((FT_Renderer_conflict)pFVar5->data == renderer) break;
    pFVar5 = pFVar5->next;
  }
  pFVar1 = pFVar5->prev;
  if (pFVar1 != (FT_ListNode)0x0) {
    pFVar2 = pFVar5->next;
    pFVar1->next = pFVar2;
    pFVar6 = (FT_ListNode)&(library->renderers).tail;
    if (pFVar2 != (FT_ListNode)0x0) {
      pFVar6 = pFVar2;
    }
    pFVar6->prev = pFVar1;
    pFVar5->prev = (FT_ListNode)0x0;
    pFVar1 = (library->renderers).head;
    pFVar5->next = pFVar1;
    pFVar1->prev = pFVar5;
    (library->renderers).head = pFVar5;
  }
  if (renderer->glyph_format == FT_GLYPH_FORMAT_OUTLINE) {
    library->cur_renderer = renderer;
  }
  if (num_params == 0) {
    return 0;
  }
  p_Var3 = renderer->clazz->set_mode;
  do {
    FVar4 = (*p_Var3)(renderer,parameters->tag,parameters->data);
    if (FVar4 != 0) {
      return FVar4;
    }
    parameters = parameters + 1;
    num_params = num_params - 1;
  } while (num_params != 0);
  return 0;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Set_Renderer( FT_Library     library,
                   FT_Renderer    renderer,
                   FT_UInt        num_params,
                   FT_Parameter*  parameters )
  {
    FT_ListNode  node;
    FT_Error     error = FT_Err_Ok;

    FT_Renderer_SetModeFunc  set_mode;


    if ( !library )
    {
      error = FT_THROW( Invalid_Library_Handle );
      goto Exit;
    }

    if ( !renderer )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    if ( num_params > 0 && !parameters )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    node = FT_List_Find( &library->renderers, renderer );
    if ( !node )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    FT_List_Up( &library->renderers, node );

    if ( renderer->glyph_format == FT_GLYPH_FORMAT_OUTLINE )
      library->cur_renderer = renderer;

    set_mode = renderer->clazz->set_mode;

    for ( ; num_params > 0; num_params-- )
    {
      error = set_mode( renderer, parameters->tag, parameters->data );
      if ( error )
        break;
      parameters++;
    }

  Exit:
    return error;
  }